

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O2

QStringList *
QCommandLineOptionPrivate::removeInvalidNames
          (QStringList *__return_storage_ptr__,QStringList nameList)

{
  IsInvalidName *pIVar1;
  IsInvalidName *pIVar2;
  result_type rVar3;
  iterator aend;
  iterator iVar4;
  ulong uVar5;
  QArrayDataPointer<QString> *in_RSI;
  QArrayDataPointer<QString> *name;
  long lVar6;
  QArrayDataPointer<QString> *other;
  const_iterator abegin;
  IsInvalidName *this;
  IsInvalidName *pIVar7;
  
  uVar5 = in_RSI->size;
  if (uVar5 == 0) goto LAB_001241c4;
  pIVar2 = (IsInvalidName *)in_RSI->ptr;
  lVar6 = uVar5 * 0x18;
  pIVar1 = pIVar2 + lVar6;
  name = in_RSI;
  this = pIVar2;
  for (uVar5 = uVar5 >> 2; pIVar7 = this, 0 < (long)uVar5; uVar5 = uVar5 - 1) {
    rVar3 = anon_unknown.dwarf_3e8ad8::IsInvalidName::operator()(this,(QString *)name);
    if (rVar3) goto LAB_0012415e;
    rVar3 = anon_unknown.dwarf_3e8ad8::IsInvalidName::operator()(this + 0x18,(QString *)name);
    pIVar7 = this + 0x18;
    if (rVar3) goto LAB_0012415e;
    rVar3 = anon_unknown.dwarf_3e8ad8::IsInvalidName::operator()(this + 0x30,(QString *)name);
    pIVar7 = this + 0x30;
    if (rVar3) goto LAB_0012415e;
    rVar3 = anon_unknown.dwarf_3e8ad8::IsInvalidName::operator()(this + 0x48,(QString *)name);
    pIVar7 = this + 0x48;
    if (rVar3) goto LAB_0012415e;
    this = this + 0x60;
    lVar6 = lVar6 + -0x60;
  }
  lVar6 = lVar6 / 0x18;
  if (lVar6 == 1) {
LAB_001241f5:
    rVar3 = anon_unknown.dwarf_3e8ad8::IsInvalidName::operator()(this,(QString *)name);
    pIVar7 = pIVar1;
    if (rVar3) {
      pIVar7 = this;
    }
  }
  else if (lVar6 == 2) {
LAB_00124142:
    rVar3 = anon_unknown.dwarf_3e8ad8::IsInvalidName::operator()(pIVar7,(QString *)name);
    if (!rVar3) {
      this = pIVar7 + 0x18;
      goto LAB_001241f5;
    }
  }
  else {
    pIVar7 = pIVar1;
    if ((lVar6 == 3) &&
       (rVar3 = anon_unknown.dwarf_3e8ad8::IsInvalidName::operator()(this,(QString *)name),
       pIVar7 = this, !rVar3)) {
      pIVar7 = this + 0x18;
      goto LAB_00124142;
    }
  }
LAB_0012415e:
  if (((long)pIVar7 - (long)pIVar2) / 0x18 != in_RSI->size) {
    aend = QList<QString>::end((QList<QString> *)in_RSI);
    iVar4 = QList<QString>::begin((QList<QString> *)in_RSI);
    other = (QArrayDataPointer<QString> *)((long)iVar4.i + ((long)pIVar7 - (long)pIVar2));
    abegin.i = (QString *)other;
    while (other = other + 1, other != (QArrayDataPointer<QString> *)aend.i) {
      rVar3 = anon_unknown.dwarf_3e8ad8::IsInvalidName::operator()
                        ((IsInvalidName *)other,(QString *)name);
      if (!rVar3) {
        name = other;
        QArrayDataPointer<char16_t>::swap(&(abegin.i)->d,(QArrayDataPointer<char16_t> *)other);
        abegin.i = abegin.i + 1;
      }
    }
    QList<QString>::erase((QList<QString> *)in_RSI,abegin,(const_iterator)aend.i);
  }
LAB_001241c4:
  QArrayDataPointer<QString>::QArrayDataPointer(&__return_storage_ptr__->d,in_RSI);
  return __return_storage_ptr__;
}

Assistant:

QStringList QCommandLineOptionPrivate::removeInvalidNames(QStringList nameList)
{
    if (Q_UNLIKELY(nameList.isEmpty()))
        qWarning("QCommandLineOption: Options must have at least one name");
    else
        nameList.removeIf(IsInvalidName());
    return nameList;
}